

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void libtorrent::aux::anon_unknown_135::refresh_endpoint_list
               (session_interface *ses,bool is_ssl,bool complete_sent,announce_entry *ae)

{
  session_interface *psVar1;
  bool bVar2;
  size_type sVar3;
  vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
  *pvVar4;
  __normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
  local_e8;
  const_iterator local_e0;
  __normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
  local_d8;
  __normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
  local_d0;
  const_iterator local_c8;
  anon_class_32_4_2a230971 local_c0;
  function<void_(const_libtorrent::aux::listen_socket_handle_&)> local_a0;
  size_t local_80;
  size_t valid_endpoints;
  uint32_t ver;
  listen_socket_handle local_68 [2];
  __normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
  local_48;
  const_iterator local_40;
  __normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
  local_38;
  __normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
  local_30;
  const_iterator local_28;
  announce_entry *local_20;
  announce_entry *ae_local;
  bool complete_sent_local;
  session_interface *psStack_10;
  bool is_ssl_local;
  session_interface *ses_local;
  
  local_20 = ae;
  ae_local._6_1_ = complete_sent;
  ae_local._7_1_ = is_ssl;
  psStack_10 = ses;
  bVar2 = is_i2p_url(&ae->url);
  if (bVar2) {
    sVar3 = ::std::
            vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
            ::size(&local_20->endpoints);
    if (sVar3 < 2) {
      bVar2 = ::std::
              vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
              ::empty(&local_20->endpoints);
      if (bVar2) {
        pvVar4 = &local_20->endpoints;
        local_68[0].m_sock.
        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_68[0].m_sock.
        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        listen_socket_handle::listen_socket_handle(local_68);
        ::std::
        vector<libtorrent::aux::announce_endpoint,std::allocator<libtorrent::aux::announce_endpoint>>
        ::emplace_back<libtorrent::aux::listen_socket_handle,bool_const&>
                  ((vector<libtorrent::aux::announce_endpoint,std::allocator<libtorrent::aux::announce_endpoint>>
                    *)pvVar4,local_68,(bool *)((long)&ae_local + 6));
        listen_socket_handle::~listen_socket_handle(local_68);
      }
    }
    else {
      pvVar4 = &local_20->endpoints;
      local_38._M_current =
           (announce_endpoint *)
           ::std::
           vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
           ::begin(&local_20->endpoints);
      local_30 = __gnu_cxx::
                 __normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
                 ::operator+(&local_38,1);
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::announce_endpoint_const*,std::vector<libtorrent::aux::announce_endpoint,std::allocator<libtorrent::aux::announce_endpoint>>>
      ::__normal_iterator<libtorrent::aux::announce_endpoint*>
                ((__normal_iterator<libtorrent::aux::announce_endpoint_const*,std::vector<libtorrent::aux::announce_endpoint,std::allocator<libtorrent::aux::announce_endpoint>>>
                  *)&local_28,&local_30);
      local_48._M_current =
           (announce_endpoint *)
           ::std::
           vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
           ::end(&local_20->endpoints);
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::announce_endpoint_const*,std::vector<libtorrent::aux::announce_endpoint,std::allocator<libtorrent::aux::announce_endpoint>>>
      ::__normal_iterator<libtorrent::aux::announce_endpoint*>
                ((__normal_iterator<libtorrent::aux::announce_endpoint_const*,std::vector<libtorrent::aux::announce_endpoint,std::allocator<libtorrent::aux::announce_endpoint>>>
                  *)&local_40,&local_48);
      ::std::
      vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
      ::erase(pvVar4,local_28,local_40);
    }
  }
  else {
    valid_endpoints._0_4_ = (*(psStack_10->super_session_logger)._vptr_session_logger[0x23])();
    psVar1 = psStack_10;
    if ((uint32_t)valid_endpoints != local_20->listen_socket_version) {
      local_80 = 0;
      local_c0.is_ssl = (bool *)((long)&ae_local + 7);
      local_c0.ae = local_20;
      local_c0.valid_endpoints = &local_80;
      local_c0.complete_sent = (bool *)((long)&ae_local + 6);
      ::std::function<void(libtorrent::aux::listen_socket_handle_const&)>::
      function<libtorrent::aux::(anonymous_namespace)::refresh_endpoint_list(libtorrent::aux::session_interface&,bool,bool,libtorrent::aux::announce_entry&)::__0,void>
                ((function<void(libtorrent::aux::listen_socket_handle_const&)> *)&local_a0,&local_c0
                );
      (*(psVar1->super_session_logger)._vptr_session_logger[0x24])(psVar1,&local_a0);
      ::std::function<void_(const_libtorrent::aux::listen_socket_handle_&)>::~function(&local_a0);
      pvVar4 = &local_20->endpoints;
      local_d8._M_current =
           (announce_endpoint *)
           ::std::
           vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
           ::begin(&local_20->endpoints);
      local_d0 = __gnu_cxx::
                 __normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
                 ::operator+(&local_d8,(long)(int)local_80);
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::announce_endpoint_const*,std::vector<libtorrent::aux::announce_endpoint,std::allocator<libtorrent::aux::announce_endpoint>>>
      ::__normal_iterator<libtorrent::aux::announce_endpoint*>
                ((__normal_iterator<libtorrent::aux::announce_endpoint_const*,std::vector<libtorrent::aux::announce_endpoint,std::allocator<libtorrent::aux::announce_endpoint>>>
                  *)&local_c8,&local_d0);
      local_e8._M_current =
           (announce_endpoint *)
           ::std::
           vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
           ::end(&local_20->endpoints);
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::announce_endpoint_const*,std::vector<libtorrent::aux::announce_endpoint,std::allocator<libtorrent::aux::announce_endpoint>>>
      ::__normal_iterator<libtorrent::aux::announce_endpoint*>
                ((__normal_iterator<libtorrent::aux::announce_endpoint_const*,std::vector<libtorrent::aux::announce_endpoint,std::allocator<libtorrent::aux::announce_endpoint>>>
                  *)&local_e0,&local_e8);
      ::std::
      vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
      ::erase(pvVar4,local_c8,local_e0);
      local_20->listen_socket_version = (uint32_t)valid_endpoints;
    }
  }
  return;
}

Assistant:

void refresh_endpoint_list(aux::session_interface& ses
		, bool const is_ssl, bool const complete_sent
		, aux::announce_entry& ae)
	{
#if TORRENT_USE_I2P
		if (is_i2p_url(ae.url))
		{
			if (ae.endpoints.size() > 1)
			{
				ae.endpoints.erase(ae.endpoints.begin() + 1, ae.endpoints.end());
			}
			else if (ae.endpoints.empty())
			{
				ae.endpoints.emplace_back(aux::listen_socket_handle(), complete_sent);
			}
			return;
		}
#endif

		auto const ver = ses.listen_socket_version();
		if (ver == ae.listen_socket_version)
			return;

		// update the endpoint list by adding entries for new listen sockets
		// and removing entries for non-existent ones
		std::size_t valid_endpoints = 0;
		ses.for_each_listen_socket([&](aux::listen_socket_handle const& s) {
			if (s.is_ssl() != is_ssl)
				return;
			for (auto& aep : ae.endpoints)
			{
				if (aep.socket != s) continue;
				std::swap(ae.endpoints[valid_endpoints], aep);
				valid_endpoints++;
				return;
			}

			ae.endpoints.emplace_back(s, complete_sent);
			std::swap(ae.endpoints[valid_endpoints], ae.endpoints.back());
			valid_endpoints++;
		});

#if TORRENT_USE_RTC
		if(auto pos = ae.url.find(':'); pos != string_view::npos)
		{
			string_view const protocol = string_view(ae.url).substr(0, pos);
			if (protocol == "ws" || protocol == "wss")
			{
				// WebSocket trackers will ignore the endpoint anyway
				valid_endpoints = std::min(valid_endpoints, std::size_t(1));
			}
		}
#endif

		TORRENT_ASSERT(valid_endpoints <= ae.endpoints.size());
		ae.endpoints.erase(ae.endpoints.begin() + int(valid_endpoints), ae.endpoints.end());
		ae.listen_socket_version = ver;
	}